

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::AddDefaultCommands(cmake *this)

{
  pointer ppcVar1;
  vector<cmCommand_*,_std::allocator<cmCommand_*>_> commands;
  vector<cmCommand_*,_std::allocator<cmCommand_*>_> local_28;
  
  local_28.super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetBootstrapCommands1(&local_28);
  GetBootstrapCommands2(&local_28);
  GetPredefinedCommands(&local_28);
  ppcVar1 = local_28.super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_28.super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_28.super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      cmState::AddCommand(this->State,*ppcVar1);
      ppcVar1 = ppcVar1 + 1;
    } while (ppcVar1 !=
             local_28.super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_28.super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmake::AddDefaultCommands()
{
  std::vector<cmCommand*> commands;
  GetBootstrapCommands1(commands);
  GetBootstrapCommands2(commands);
  GetPredefinedCommands(commands);
  for(std::vector<cmCommand*>::iterator i = commands.begin();
      i != commands.end(); ++i)
    {
    this->State->AddCommand(*i);
    }
}